

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

HighsInt __thiscall
HighsDomain::ConflictSet::resolveDepth
          (ConflictSet *this,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *frontier,HighsInt depthLevel,HighsInt stopSize,HighsInt minResolve,
          bool increaseConflictScore)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  HighsInt HVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pLVar9;
  reference pLVar10;
  pointer pHVar11;
  pointer pLVar12;
  double *pdVar13;
  int in_ECX;
  int in_EDX;
  long *in_RDI;
  int in_R8D;
  byte in_R9B;
  pair<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_bool> pVar14;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *in_stack_00000030;
  ConflictSet *in_stack_00000038;
  LocalDomChg in_stack_00000050;
  pair<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_bool> insertResult;
  LocalDomChg *i;
  iterator __end2;
  iterator __begin2;
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *__range2;
  iterator pos;
  HighsInt numResolved;
  iterator it;
  bool empty;
  iterator iterEnd;
  HighsInt branchPos;
  LocalDomChg startPos;
  ConflictSet *in_stack_fffffffffffffe88;
  ConflictSet *this_00;
  key_type *in_stack_fffffffffffffe90;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *in_stack_fffffffffffffe98;
  const_iterator __position;
  HighsPseudocost *in_stack_fffffffffffffea0;
  ConflictSet *in_stack_fffffffffffffea8;
  iterator in_stack_fffffffffffffeb0;
  bool local_132;
  int local_114;
  __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  local_c8;
  long *local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  ConflictSet *local_a8;
  key_type *local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  int local_84;
  _Base_ptr local_80;
  _Self local_78;
  byte local_69;
  value_type local_68;
  undefined1 auStack_60 [16];
  _Self local_50;
  int local_44;
  int local_40;
  undefined1 auStack_38 [19];
  byte local_25;
  int local_24;
  int local_20;
  int local_1c;
  int local_4;
  
  local_25 = in_R9B & 1;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  clearQueue((ConflictSet *)0x5cb4db);
  if (local_1c == 0) {
    local_114 = 0;
  }
  else {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2c0),(long)(local_1c + -1)
                       );
    local_114 = *pvVar6 + 1;
  }
  local_40 = local_114;
  memset(auStack_38,0,0x10);
  for (; iVar2 = local_1c,
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2c0)), iVar2 < (int)sVar5
      ; local_1c = local_1c + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2c0),(long)local_1c);
    local_44 = *pvVar6;
    pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                        (*in_RDI + 0x48),(long)local_44);
    dVar1 = pvVar7->boundval;
    pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        (*in_RDI + 0x78),(long)local_44);
    if ((dVar1 != pvVar8->first) || (NAN(dVar1) || NAN(pvVar8->first))) break;
  }
  iVar2 = local_1c;
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2c0));
  if (iVar2 == (int)sVar5) {
    local_50._M_node =
         (_Base_ptr)
         std::
         set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
         ::end((set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                *)in_stack_fffffffffffffe88);
  }
  else {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2c0),(long)local_1c);
    local_68 = *pvVar6;
    memset(auStack_60,0,0x10);
    local_50._M_node =
         (_Base_ptr)
         std::
         set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
         ::upper_bound(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  local_69 = 1;
  local_78._M_node =
       (_Base_ptr)
       std::
       set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
       ::lower_bound(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  while (bVar3 = std::operator!=(&local_78,&local_50), bVar3) {
    local_69 = 0;
    std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::operator->
              ((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *)0x5cb6fe);
    bVar3 = resolvable(in_stack_fffffffffffffe88,0);
    if (bVar3) {
      local_80 = local_78._M_node;
      pushQueue(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
    }
    std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::operator++
              ((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *)
               in_stack_fffffffffffffe90);
  }
  if ((local_69 & 1) == 0) {
    local_84 = 0;
    while( true ) {
      HVar4 = queueSize((ConflictSet *)0x5cb772);
      local_132 = true;
      if (HVar4 <= local_20) {
        HVar4 = queueSize((ConflictSet *)0x5cb78d);
        local_132 = 0 < HVar4 && local_84 < local_24;
      }
      if (!local_132) break;
      local_90 = (_Base_ptr)popQueue(in_stack_fffffffffffffea8);
      pLVar9 = std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::operator*
                         ((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *)
                          in_stack_fffffffffffffe90);
      this_00 = *(ConflictSet **)pLVar9;
      in_stack_fffffffffffffe90 = (key_type *)(pLVar9->domchg).boundval;
      __position._M_node = *(_Base_ptr *)&(pLVar9->domchg).column;
      local_a8 = this_00;
      local_a0 = in_stack_fffffffffffffe90;
      local_98 = __position._M_node;
      bVar3 = explainBoundChange(in_stack_00000038,in_stack_00000030,in_stack_00000050);
      if (bVar3) {
        local_84 = local_84 + 1;
        local_b0 = local_90;
        local_b8 = (_Base_ptr)
                   std::
                   set<HighsDomain::ConflictSet::LocalDomChg,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                   ::erase_abi_cxx11_((set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                       *)in_stack_fffffffffffffe90,__position);
        local_c0 = in_RDI + 0x11;
        local_c8._M_current =
             (LocalDomChg *)
             std::
             vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
             ::begin((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                      *)this_00);
        std::
        vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
        ::end((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
               *)this_00);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                                   *)in_stack_fffffffffffffe90,
                                  (__normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                                   *)this_00), bVar3) {
          pLVar10 = __gnu_cxx::
                    __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                    ::operator*(&local_c8);
          pVar14 = std::
                   set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   ::insert((set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                             *)in_stack_fffffffffffffeb0._M_node,
                            (value_type *)in_stack_fffffffffffffea8);
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            if ((pLVar10->domchg).boundtype == kLower) {
              pLVar12 = std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::
                        operator->((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *
                                   )0x5cba90);
              pdVar13 = std::max<double>(&(pLVar12->domchg).boundval,&(pLVar10->domchg).boundval);
              in_stack_fffffffffffffea8 = (ConflictSet *)*pdVar13;
              pLVar12 = std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::
                        operator->((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *
                                   )0x5cbabf);
              (pLVar12->domchg).boundval = (double)in_stack_fffffffffffffea8;
            }
            else {
              pLVar12 = std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::
                        operator->((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *
                                   )0x5cbad9);
              pdVar13 = std::min<double>(&(pLVar12->domchg).boundval,&(pLVar10->domchg).boundval);
              in_stack_fffffffffffffea0 = (HighsPseudocost *)*pdVar13;
              pLVar12 = std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>::
                        operator->((_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> *
                                   )0x5cbb08);
              (pLVar12->domchg).boundval = (double)in_stack_fffffffffffffea0;
            }
          }
          else {
            if ((local_25 & 1) != 0) {
              pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                       operator[]((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                                  (*in_RDI + 0x48),(long)pLVar10->pos);
              if (pvVar7->boundtype == kLower) {
                std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            *)0x5cb998);
                std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                          ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                           (*in_RDI + 0x48),(long)pLVar10->pos);
                HighsPseudocost::increaseConflictScoreUp
                          (in_stack_fffffffffffffea0,(HighsInt)((ulong)__position._M_node >> 0x20));
              }
              else {
                pHVar11 = std::
                          unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                          operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                      *)0x5cb9ed);
                in_stack_fffffffffffffeb0._M_node = (_Base_ptr)&pHVar11->pseudocost;
                std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                          ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                           (*in_RDI + 0x48),(long)pLVar10->pos);
                HighsPseudocost::increaseConflictScoreDown
                          (in_stack_fffffffffffffea0,(HighsInt)((ulong)__position._M_node >> 0x20));
              }
            }
            if ((local_40 <= pLVar10->pos) && (bVar3 = resolvable(this_00,0), bVar3)) {
              pushQueue(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
            }
          }
          __gnu_cxx::
          __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
          ::operator++(&local_c8);
        }
      }
    }
    local_4 = local_84;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

HighsInt HighsDomain::ConflictSet::resolveDepth(std::set<LocalDomChg>& frontier,
                                                HighsInt depthLevel,
                                                HighsInt stopSize,
                                                HighsInt minResolve,
                                                bool increaseConflictScore) {
  clearQueue();
  LocalDomChg startPos =
      LocalDomChg{depthLevel == 0 ? 0 : localdom.branchPos_[depthLevel - 1] + 1,
                  HighsDomainChange()};
  while (depthLevel < (HighsInt)localdom.branchPos_.size()) {
    HighsInt branchPos = localdom.branchPos_[depthLevel];
    if (localdom.domchgstack_[branchPos].boundval !=
        localdom.prevboundval_[branchPos].first)
      break;
    // printf("skipping redundant depth\n");
    ++depthLevel;
  }

  auto iterEnd =
      depthLevel == (HighsInt)localdom.branchPos_.size()
          ? frontier.end()
          : frontier.upper_bound(LocalDomChg{localdom.branchPos_[depthLevel],
                                             HighsDomainChange()});
  bool empty = true;
  for (auto it = frontier.lower_bound(startPos); it != iterEnd; ++it) {
    assert(it != frontier.end());
    empty = false;
    if (resolvable(it->pos)) pushQueue(it);
  }

  if (empty) return -1;

  HighsInt numResolved = 0;

  while (queueSize() > stopSize ||
         (queueSize() > 0 && numResolved < minResolve)) {
    std::set<LocalDomChg>::iterator pos = popQueue();
    if (!explainBoundChange(frontier, *pos)) continue;

    ++numResolved;
    frontier.erase(pos);
    for (const LocalDomChg& i : resolvedDomainChanges) {
      auto insertResult = frontier.insert(i);
      if (insertResult.second) {
        if (increaseConflictScore) {
          if (localdom.domchgstack_[i.pos].boundtype == HighsBoundType::kLower)
            localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreUp(
                localdom.domchgstack_[i.pos].column);
          else
            localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreDown(
                localdom.domchgstack_[i.pos].column);
        }
        if (i.pos >= startPos.pos && resolvable(i.pos))
          pushQueue(insertResult.first);
      } else {
        if (i.domchg.boundtype == HighsBoundType::kLower) {
          // if (insertResult.first->domchg.boundval != i.domchg.boundval)
          //  printf(
          //      "got different relaxed lower bounds: current=%g, new=%g, "
          //      "stack=%g\n",
          //      insertResult.first->domchg.boundval, i.domchg.boundval,
          //      localdom.domchgstack_[i.pos].boundval);
          //
          insertResult.first->domchg.boundval =
              std::max(insertResult.first->domchg.boundval, i.domchg.boundval);
        } else {
          // if (insertResult.first->domchg.boundval != i.domchg.boundval)
          //   printf(
          //       "got different relaxed upper bounds: current=%g, new=%g, "
          //       "stack=%g\n",
          //       insertResult.first->domchg.boundval, i.domchg.boundval,
          //       localdom.domchgstack_[i.pos].boundval);
          insertResult.first->domchg.boundval =
              std::min(insertResult.first->domchg.boundval, i.domchg.boundval);
        }
      }
    }
  }

  return numResolved;
}